

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O3

string * __thiscall
deci::parser_t::yytnamerr__abi_cxx11_(string *__return_storage_ptr__,parser_t *this,char *yystr)

{
  byte bVar1;
  pointer pcVar2;
  parser_t *ppVar3;
  size_t sVar4;
  parser_t *ppVar5;
  string *yyr;
  
  if (*(char *)&this->_vptr_parser_t == '\"') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ppVar5 = this;
    do {
      ppVar3 = (parser_t *)((long)&ppVar5->_vptr_parser_t + 1);
      bVar1 = *(byte *)((long)&ppVar5->_vptr_parser_t + 1);
      if (bVar1 < 0x5c) {
        if (bVar1 == 0x22) {
          return __return_storage_ptr__;
        }
        if ((bVar1 == 0x27) || (bVar1 == 0x2c)) goto LAB_0010f3e9;
      }
      else if (bVar1 == 0x5c) {
        if (*(char *)((long)&ppVar5->_vptr_parser_t + 2) != '\\') goto LAB_0010f3e9;
        ppVar3 = (parser_t *)((long)&ppVar5->_vptr_parser_t + 2);
      }
      ppVar5 = ppVar3;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    } while( true );
  }
LAB_0010f3f6:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this,(long)&this->_vptr_parser_t + sVar4);
  return __return_storage_ptr__;
LAB_0010f3e9:
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &__return_storage_ptr__->field_2) {
    operator_delete(pcVar2);
  }
  goto LAB_0010f3f6;
}

Assistant:

std::string
   parser_t ::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }